

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

ostream * smf::Binasc::writeLittleEndianULong(ostream *out,ulong value)

{
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_23,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_24,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_22,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_21,1);
  return out;
}

Assistant:

std::ostream& Binasc::writeLittleEndianULong(std::ostream& out, ulong value) {
	union { char bytes[4]; ulong ul; } data;
	data.ul = value;
	out << data.bytes[0];
	out << data.bytes[1];
	out << data.bytes[2];
	out << data.bytes[3];
	return out;
}